

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

curl_socket_t Curl_conn_get_socket(Curl_easy *data,int sockindex)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  Curl_cfilter *pCVar3;
  curl_socket_t sock;
  undefined8 uStack_18;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    pCVar3 = (Curl_cfilter *)0x0;
  }
  else {
    pCVar3 = pcVar1->cfilter[sockindex];
  }
  if ((pCVar3 == (Curl_cfilter *)0x0) || ((pCVar3->field_0x24 & 1) != 0)) {
    if (pcVar1 == (connectdata *)0x0) {
      uStack_18._4_4_ = 0xffffffff;
    }
    else {
      uStack_18._4_4_ = pcVar1->sock[sockindex];
    }
  }
  else {
    uStack_18 = data;
    CVar2 = (*pCVar3->cft->query)(pCVar3,data,3,(int *)0x0,(void *)((long)&uStack_18 + 4));
    uStack_18._4_4_ = -(uint)(CVar2 != CURLE_OK) | uStack_18._4_4_;
  }
  return uStack_18._4_4_;
}

Assistant:

curl_socket_t Curl_conn_get_socket(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn ? data->conn->cfilter[sockindex] : NULL;
  /* if the top filter has not connected, ask it (and its sub-filters)
   * for the socket. Otherwise conn->sock[sockindex] should have it.
   */
  if(cf && !cf->connected)
    return Curl_conn_cf_get_socket(cf, data);
  return data->conn ? data->conn->sock[sockindex] : CURL_SOCKET_BAD;
}